

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

int nn_ws_optset_setopt(nn_optset *self,int option,void *optval,size_t optvallen)

{
  int iVar1;
  
  iVar1 = -0x16;
  if ((optvallen == 4) && (iVar1 = -0x5c, option == 1)) {
    iVar1 = -0x16;
    if (*optval - 1U < 2) {
      *(int *)&self[1].vfptr = *optval;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int nn_ws_optset_setopt (struct nn_optset *self, int option,
    const void *optval, size_t optvallen)
{
    struct nn_ws_optset *optset;
    int val;

    optset = nn_cont (self, struct nn_ws_optset, base);
    if (optvallen != sizeof (int)) {
        return -EINVAL;
    }
    val = *(int *)optval;

    switch (option) {
    case NN_WS_MSG_TYPE:
        switch (val) {
        case NN_WS_MSG_TYPE_TEXT:
        case NN_WS_MSG_TYPE_BINARY:
	    optset->msg_type = val;
            return 0;
        default:
            return -EINVAL;
        }
    default:
        return -ENOPROTOOPT;
    }
}